

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall
(anonymous_namespace)::FileSetType::WriteProperties<std::__cxx11::string>
          (FileSetType *this,cmTarget *tgt,cmTargetInternals *impl,string *prop,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,Action action)

{
  cmMakefile *pcVar1;
  string_view fileSetType;
  string_view sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  string *psVar4;
  cmTargetInternals *pcVar5;
  bool bVar6;
  ulong uVar7;
  string local_2e8;
  string_view local_2c8;
  size_t local_2b8;
  char *pcStack_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  undefined1 local_268 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileSetName_1;
  string local_228;
  string_view local_208;
  size_t local_1f8;
  char *pcStack_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  undefined1 local_1a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileSetName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  allocator<char> local_119;
  string local_118;
  size_t local_f8;
  undefined8 local_f0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_e8;
  size_t local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  allocator<char> local_81;
  string local_80;
  size_t local_60;
  undefined8 local_58;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_50;
  Action local_3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_38;
  Action action_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  string *prop_local;
  cmTargetInternals *impl_local;
  cmTarget *tgt_local;
  FileSetType *this_local;
  
  local_3c = action;
  pbStack_38 = value;
  value_local = prop;
  prop_local = (string *)impl;
  impl_local = (cmTargetInternals *)tgt;
  tgt_local = (cmTarget *)this;
  local_50 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)prop);
  local_60 = ((basic_string_view<char,_std::char_traits<char>_> *)(this + 0x10))->_M_len;
  local_58 = *(undefined8 *)(this + 0x18);
  bVar6 = std::operator==(local_50,*(basic_string_view<char,_std::char_traits<char>_> *)
                                    (this + 0x10));
  pcVar5 = impl_local;
  psVar4 = prop_local;
  if (bVar6) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<cm::static_string_view,void>
              ((string *)&local_80,(static_string_view *)this,&local_81);
    std::__cxx11::string::string((string *)&local_b8,(string *)value);
    local_c8 = *(undefined8 *)this;
    uStack_c0 = *(undefined8 *)(this + 8);
    local_d8 = ((string_view *)(this + 0x60))->_M_len;
    uStack_d0 = *(undefined8 *)(this + 0x68);
    cmTargetInternals::AddDirectoryToFileSet<std::__cxx11::string>
              ((cmTargetInternals *)psVar4,(cmTarget *)pcVar5,&local_80,&local_b8,
               *(string_view *)this,*(string_view *)(this + 0x60),local_3c);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    this_local._7_1_ = 1;
  }
  else {
    local_e8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)value_local);
    local_f8 = ((basic_string_view<char,_std::char_traits<char>_> *)(this + 0x20))->_M_len;
    local_f0 = *(undefined8 *)(this + 0x28);
    bVar6 = std::operator==(local_e8,*(basic_string_view<char,_std::char_traits<char>_> *)
                                      (this + 0x20));
    pcVar5 = impl_local;
    psVar4 = prop_local;
    if (bVar6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<cm::static_string_view,void>
                ((string *)&local_118,(static_string_view *)this,&local_119);
      std::__cxx11::string::string((string *)&local_140,(string *)value);
      cmTargetInternals::AddPathToFileSet<std::__cxx11::string>
                ((cmTargetInternals *)psVar4,(cmTarget *)pcVar5,&local_118,&local_140,
                 *(string_view *)this,*(string_view *)(this + 0x60),local_3c);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
      this_local._7_1_ = 1;
    }
    else {
      sVar2 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)value_local);
      fileSetName.field_2._8_8_ = ((string_view *)(this + 0x30))->_M_len;
      bVar6 = cmHasPrefix(sVar2,*(string_view *)(this + 0x30));
      pbVar3 = value_local;
      if (bVar6) {
        std::basic_string_view<char,_std::char_traits<char>_>::size
                  ((basic_string_view<char,_std::char_traits<char>_> *)(this + 0x30));
        std::__cxx11::string::substr((ulong)local_1a8,(ulong)pbVar3);
        uVar7 = std::__cxx11::string::empty();
        pcVar5 = impl_local;
        psVar4 = prop_local;
        if ((uVar7 & 1) == 0) {
          std::__cxx11::string::string((string *)&local_1e8,(string *)value);
          local_1f8 = *(size_t *)this;
          pcStack_1f0 = *(char **)(this + 8);
          cmStrCat<cm::static_string_view_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                    (&local_228,(static_string_view *)(this + 0x70),(char (*) [3])0x112d6c1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     (char (*) [2])0x11593aa);
          local_208 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_228)
          ;
          sVar2._M_str = pcStack_1f0;
          sVar2._M_len = local_1f8;
          cmTargetInternals::AddDirectoryToFileSet<std::__cxx11::string>
                    ((cmTargetInternals *)psVar4,(cmTarget *)pcVar5,(string *)local_1a8,&local_1e8,
                     sVar2,local_208,local_3c);
          std::__cxx11::string::~string((string *)&local_228);
          std::__cxx11::string::~string((string *)&local_1e8);
        }
        else {
          pcVar1 = (cmMakefile *)prop_local->_M_string_length;
          cmStrCat<cm::static_string_view_const&,char_const(&)[23]>
                    (&local_1c8,(static_string_view *)(this + 0x70),
                     (char (*) [23])" name cannot be empty.");
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
        }
        this_local._7_1_ = 1;
        std::__cxx11::string::~string((string *)local_1a8);
      }
      else {
        sVar2 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)value_local);
        fileSetName_1.field_2._8_8_ = ((string_view *)(this + 0x40))->_M_len;
        bVar6 = cmHasPrefix(sVar2,*(string_view *)(this + 0x40));
        pbVar3 = value_local;
        if (bVar6) {
          std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)(this + 0x40));
          std::__cxx11::string::substr((ulong)local_268,(ulong)pbVar3);
          uVar7 = std::__cxx11::string::empty();
          pcVar5 = impl_local;
          psVar4 = prop_local;
          if ((uVar7 & 1) == 0) {
            std::__cxx11::string::string((string *)&local_2a8,(string *)value);
            local_2b8 = *(size_t *)this;
            pcStack_2b0 = *(char **)(this + 8);
            cmStrCat<cm::static_string_view_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                      (&local_2e8,(static_string_view *)(this + 0x70),(char (*) [3])0x112d6c1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_268,(char (*) [2])0x11593aa);
            local_2c8 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)&local_2e8);
            fileSetType._M_str = pcStack_2b0;
            fileSetType._M_len = local_2b8;
            cmTargetInternals::AddPathToFileSet<std::__cxx11::string>
                      ((cmTargetInternals *)psVar4,(cmTarget *)pcVar5,(string *)local_268,&local_2a8
                       ,fileSetType,local_2c8,local_3c);
            std::__cxx11::string::~string((string *)&local_2e8);
            std::__cxx11::string::~string((string *)&local_2a8);
          }
          else {
            pcVar1 = (cmMakefile *)prop_local->_M_string_length;
            cmStrCat<cm::static_string_view_const&,char_const(&)[23]>
                      (&local_288,(static_string_view *)(this + 0x70),
                       (char (*) [23])" name cannot be empty.");
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_288);
            std::__cxx11::string::~string((string *)&local_288);
          }
          this_local._7_1_ = 1;
          std::__cxx11::string::~string((string *)local_268);
        }
        else {
          this_local._7_1_ = 0;
        }
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool FileSetType::WriteProperties(cmTarget* tgt, cmTargetInternals* impl,
                                  const std::string& prop, ValueType value,
                                  Action action)
{
  if (prop == this->DefaultDirectoryProperty) {
    impl->AddDirectoryToFileSet(tgt, std::string(this->TypeName), value,
                                this->TypeName, this->DefaultDescription,
                                action);
    return true;
  }
  if (prop == this->DefaultPathProperty) {
    impl->AddPathToFileSet(tgt, std::string(this->TypeName), value,
                           this->TypeName, this->DefaultDescription, action);
    return true;
  }
  if (cmHasPrefix(prop, this->DirectoryPrefix)) {
    auto fileSetName = prop.substr(this->DirectoryPrefix.size());
    if (fileSetName.empty()) {
      impl->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(this->ArbitraryDescription, " name cannot be empty."));
    } else {
      impl->AddDirectoryToFileSet(
        tgt, fileSetName, value, this->TypeName,
        cmStrCat(this->ArbitraryDescription, " \"", fileSetName, "\""),
        action);
    }
    return true;
  }
  if (cmHasPrefix(prop, this->PathPrefix)) {
    auto fileSetName = prop.substr(this->PathPrefix.size());
    if (fileSetName.empty()) {
      impl->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(this->ArbitraryDescription, " name cannot be empty."));
    } else {
      impl->AddPathToFileSet(
        tgt, fileSetName, value, this->TypeName,
        cmStrCat(this->ArbitraryDescription, " \"", fileSetName, "\""),
        action);
    }
    return true;
  }
  return false;
}